

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O3

bool __thiscall ON_MeshFace::Repair(ON_MeshFace *this,int mesh_vertex_count,ON_3dPoint *V)

{
  uint uVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  uint uVar7;
  uint uVar8;
  ON_MeshFace local_48;
  
  local_48.vi[0] = 0xffffffff;
  local_48.vi[1] = 0xffffffff;
  local_48.vi[2] = 0xffffffff;
  local_48.vi[3] = 0xffffffff;
  uVar7 = this->vi[0];
  lVar6 = 0;
  bVar3 = true;
  uVar8 = 0xffffffff;
  if (((int)uVar7 < mesh_vertex_count && -1 < (int)uVar7) &&
     (bVar2 = ON_3dPoint::IsValid(V + uVar7), bVar2)) {
    uVar8 = this->vi[0];
    lVar6 = 1;
    bVar3 = false;
    local_48.vi[0] = uVar8;
  }
  uVar7 = this->vi[1];
  if ((uVar8 == uVar7 || (mesh_vertex_count <= (int)uVar7 || (int)uVar7 < 0)) ||
     (bVar2 = ON_3dPoint::IsValid(V + uVar7), !bVar2)) {
    if (bVar3) {
      return false;
    }
LAB_004f7045:
    uVar4 = 1;
    uVar7 = 0xffffffff;
  }
  else {
    if ((!bVar3) && (bVar3 = ON_3dPoint::operator!=(V + (int)uVar8,V + this->vi[1]), !bVar3))
    goto LAB_004f7045;
    uVar4 = (int)lVar6 + 1;
    local_48.vi[lVar6] = this->vi[1];
    uVar8 = local_48.vi[0];
    uVar7 = local_48.vi[1];
  }
  uVar5 = this->vi[2];
  if ((((uVar7 == uVar5 || uVar8 == uVar5) || (mesh_vertex_count <= (int)uVar5 || (int)uVar5 < 0))
      || (bVar3 = ON_3dPoint::IsValid(V + uVar5), !bVar3)) ||
     (bVar3 = ON_3dPoint::operator!=(V + (int)uVar8,V + this->vi[2]), !bVar3)) {
    if (uVar4 < 2) {
      return false;
    }
  }
  else if ((uVar4 == 1) || (bVar3 = ON_3dPoint::operator!=(V + (int)uVar7,V + this->vi[2]), bVar3))
  {
    uVar5 = uVar4 + 1;
    local_48.vi[uVar4] = this->vi[2];
    uVar7 = local_48.vi[1];
    uVar4 = local_48.vi[2];
    goto LAB_004f70fb;
  }
  uVar5 = 2;
  uVar4 = 0xffffffff;
LAB_004f70fb:
  uVar1 = this->vi[3];
  if (((uVar4 == uVar1 ||
        ((uVar7 == uVar1 || uVar8 == uVar1) || (mesh_vertex_count <= (int)uVar1 || (int)uVar1 < 0)))
      || (bVar3 = ON_3dPoint::IsValid(V + uVar1), !bVar3)) ||
     ((bVar3 = ON_3dPoint::operator!=(V + (int)uVar8,V + this->vi[3]), !bVar3 ||
      (bVar3 = ON_3dPoint::operator!=(V + (int)uVar7,V + this->vi[3]), !bVar3)))) {
    if (uVar5 < 3) {
      return false;
    }
  }
  else if (uVar5 == 2) {
    local_48.vi[2] = this->vi[3];
    uVar4 = local_48.vi[2];
  }
  else {
    bVar3 = ON_3dPoint::operator!=(V + (int)uVar4,V + this->vi[3]);
    if (bVar3) {
      local_48.vi[uVar5] = this->vi[3];
      uVar4 = local_48.vi[3];
    }
  }
  local_48.vi[3] = uVar4;
  bVar3 = IsValid(&local_48,mesh_vertex_count);
  if (!bVar3) {
    return false;
  }
  this->vi[0] = uVar8;
  *(ulong *)(this->vi + 1) = CONCAT44(local_48.vi[2],local_48.vi[1]);
  this->vi[3] = local_48.vi[3];
  return true;
}

Assistant:

bool ON_MeshFace::Repair(
  int mesh_vertex_count,
  const ON_3dPoint* V
  )
{
  ON_MeshFace f;
  int fvi_count = 0;
  f.vi[0] = f.vi[1] = f.vi[2] = f.vi[3] = -1;
  
  if ( vi[0] >= 0 && vi[0] < mesh_vertex_count && V[vi[0]].IsValid() )
    f.vi[fvi_count++] = vi[0];

  if (vi[1] >= 0 && vi[1] < mesh_vertex_count && f.vi[0] != vi[1] && V[vi[1]].IsValid())
  {
    if ( 0 == fvi_count || V[f.vi[0]] != V[vi[1]] )
      f.vi[fvi_count++] = vi[1];
  }

  if ( fvi_count < 1 )
    return false;

  if ( vi[2] >= 0 && vi[2] < mesh_vertex_count && f.vi[0] != vi[2] && f.vi[1] != vi[2] && V[vi[2]].IsValid() && V[f.vi[0]] != V[vi[2]] )
  {
    if ( 1 == fvi_count || V[f.vi[1]] != V[vi[2]] )
      f.vi[fvi_count++] = vi[2];
  }

  if ( fvi_count < 2 )
    return false;

  if ( vi[3] >= 0 && vi[3] < mesh_vertex_count && f.vi[0] != vi[3] && f.vi[1] != vi[3] && f.vi[2] != vi[3] && V[vi[3]].IsValid() && V[f.vi[0]] != V[vi[3]] && V[f.vi[1]] != V[vi[3]] )
  {
    if ( 2 == fvi_count || V[f.vi[2]] != V[vi[3]] )
      f.vi[fvi_count++] = vi[3];
  }
  
  if ( fvi_count < 3 )
    return false;
 
  if ( 3 == fvi_count )
    f.vi[3] = f.vi[2];
  
  if ( !f.IsValid(mesh_vertex_count) )
    return false;

  vi[0] = f.vi[0];
  vi[1] = f.vi[1];
  vi[2] = f.vi[2];
  vi[3] = f.vi[3];

  return true;
}